

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agsplugin.cpp
# Opt level: O0

void AGS_EditorProperties(HWND parent)

{
  HWND parent_local;
  
  return;
}

Assistant:

void AGS_EditorProperties(HWND parent)
{
#ifdef _WIN32
	MessageBox(parent, "AGS Sockets plugin by " AUTHORS "; " RELEASE_DATE_STRING
		".", "About", MB_OK | MB_ICONINFORMATION);
#else
	// Todo: Figure out a way to do something similar on other systems
#endif
}